

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::IsSingleConfigUtility
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  string *__x;
  size_type sVar2;
  bool bVar3;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 == UTILITY) {
    __x = cmGeneratorTarget::GetName_abi_cxx11_(target);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->PerConfigUtilityTargets,__x);
    bVar3 = sVar2 == 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGlobalNinjaGenerator::IsSingleConfigUtility(
  cmGeneratorTarget const* target) const
{
  return target->GetType() == cmStateEnums::UTILITY &&
    !this->PerConfigUtilityTargets.count(target->GetName());
}